

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_utility.cpp
# Opt level: O0

subsector_t * R_PointInSubsector(fixed_t x,fixed_t y)

{
  int iVar1;
  node_t *pnStack_20;
  int side;
  node_t *node;
  fixed_t y_local;
  fixed_t x_local;
  
  if (numnodes == 0) {
    _y_local = subsectors;
  }
  else {
    pnStack_20 = nodes + (long)numnodes + -1;
    do {
      iVar1 = R_PointOnSide(x,y,pnStack_20);
      pnStack_20 = *(node_t **)((long)&pnStack_20->field_6 + (long)iVar1 * 8);
    } while (((ulong)pnStack_20 & 1) == 0);
    _y_local = (subsector_t *)((long)&pnStack_20[-1].field_6 + 0xf);
  }
  return _y_local;
}

Assistant:

subsector_t *R_PointInSubsector (fixed_t x, fixed_t y)
{
	node_t *node;
	int side;

	// single subsector is a special case
	if (numnodes == 0)
		return subsectors;
				
	node = nodes + numnodes - 1;

	do
	{
		side = R_PointOnSide (x, y, node);
		node = (node_t *)node->children[side];
	}
	while (!((size_t)node & 1));
		
	return (subsector_t *)((BYTE *)node - 1);
}